

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::readSequence(Graph *this)

{
  vector<char,std::allocator<char>> *this_00;
  long lVar1;
  iterator __position;
  long lVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  char c;
  string base;
  fstream file;
  undefined1 auStack_288 [8];
  long local_280;
  vector<char,_std::allocator<char>_> local_278;
  char *local_260;
  long local_258;
  char local_250;
  undefined7 uStack_24f;
  long local_240 [4];
  byte abStack_220 [496];
  
  local_260 = &local_250;
  local_258 = 0;
  local_250 = '\0';
  std::fstream::fstream(local_240,"sample.fasta",_S_in);
  lVar1 = *(long *)(local_240[0] + -0x18);
  if ((abStack_220[lVar1] & 2) == 0) {
    local_280 = -1;
    lVar2 = local_280;
    do {
      while( true ) {
        cVar4 = std::ios::widen((char)auStack_288 + (char)lVar1 + 'H');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_240,(string *)&local_260,cVar4);
        lVar1 = local_258;
        pcVar3 = local_260;
        if (*local_260 == '>') break;
        if (local_258 != 0) {
          lVar5 = 0;
          do {
            cVar4 = pcVar3[lVar5];
            local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,cVar4);
            if (cVar4 != ' ') {
              this_00 = (vector<char,std::allocator<char>> *)
                        ((this->sequences).
                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2);
              __position._M_current = *(char **)(this_00 + 8);
              if (__position._M_current == *(char **)(this_00 + 0x10)) {
                std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                          (this_00,__position,(char *)&local_278);
              }
              else {
                *__position._M_current = cVar4;
                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        lVar1 = *(long *)(local_240[0] + -0x18);
        if ((abStack_220[lVar1] & 2) != 0) goto LAB_0010352b;
      }
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
      ::emplace_back<std::vector<char,std::allocator<char>>>
                ((vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                  *)&this->sequences,&local_278);
      if (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_280 = local_280 + 1;
      lVar1 = *(long *)(local_240[0] + -0x18);
      lVar2 = local_280;
    } while ((abStack_220[lVar1] & 2) == 0);
  }
LAB_0010352b:
  std::fstream::~fstream(local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  return;
}

Assistant:

void Graph::readSequence(){
    string base;
    int row = -1;
    fstream file("sample.fasta", ios::in);
    while(!file.eof()){
        getline(file, base);
        if(base[0] == '>'){
            this->sequences.emplace_back(vector<char>());
            row++;
            continue;
        }else{
            for(auto c : base){
                if(c != ' ')
                    this->sequences[row].push_back(c);
            }
        }
    }
}